

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

iterator * __thiscall QTextFrame::iterator::operator--(iterator *this)

{
  BlockMap *this_00;
  char16_t cVar1;
  QTextDocumentPrivate *this_01;
  int iVar2;
  uint uVar3;
  QObject *object;
  QTextFrame *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  long *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTextDocumentPrivate **)
             (*(long *)(*(long *)&(this->f->super_QTextObject).field_0x8 + 0x10) + 8);
  this_00 = &this_01->blocks;
  if (this->cf == (QTextFrame *)0x0) {
    uVar3 = this->cb;
    if (uVar3 != this->b) {
      if (uVar3 != this->e) {
        QFragmentMapData<QTextBlockData>::position(&this_00->data,uVar3,0);
        local_48 = (long *)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QTextDocumentPrivate::find((QTextDocumentPrivate *)&local_48,(int)this_01);
        local_60.d = (this_01->text).d.d;
        local_60.ptr = (this_01->text).d.ptr;
        local_60.size = (this_01->text).d.size;
        if (local_60.d != (Data *)0x0) {
          LOCK();
          ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        cVar1 = local_60.ptr[*(int *)(*local_48 + 0x18 + ((ulong)puStack_40 & 0xffffffff) * 0x20)];
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        if (cVar1 != L'\x2029') {
          object = &QTextDocumentPrivate::objectForFormat
                              (this_01,*(int *)(*local_48 + 0x1c +
                                               ((ulong)puStack_40 & 0xffffffff) * 0x20))->
                    super_QObject;
          pQVar4 = QtPrivate::qobject_cast_helper<QTextFrame*,QObject>(object);
          if (pQVar4 != (QTextFrame *)0x0) {
            local_60.d = (this_01->text).d.d;
            local_60.ptr = (this_01->text).d.ptr;
            local_60.size = (this_01->text).d.size;
            if (local_60.d != (Data *)0x0) {
              LOCK();
              ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            cVar1 = local_60.ptr
                    [*(int *)(*local_48 + 0x18 + ((ulong)puStack_40 & 0xffffffff) * 0x20)];
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
            if (cVar1 != L'﷐') {
              local_60.d = (this_01->text).d.d;
              local_60.ptr = (this_01->text).d.ptr;
              local_60.size = (this_01->text).d.size;
              if (local_60.d != (Data *)0x0) {
                LOCK();
                ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_60.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                     1;
                UNLOCK();
              }
              cVar1 = local_60.ptr
                      [*(int *)(*local_48 + 0x18 + ((ulong)puStack_40 & 0xffffffff) * 0x20)];
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
              if (cVar1 == L'﷑') {
                this->cf = pQVar4;
                this->cb = 0;
                goto LAB_004ab01d;
              }
            }
          }
        }
        uVar3 = this->cb;
      }
      uVar3 = QFragmentMapData<QTextBlockData>::previous(&this_00->data,uVar3);
      this->cb = uVar3;
    }
  }
  else {
    iVar2 = firstPosition(this->cf);
    uVar3 = QFragmentMapData<QTextBlockData>::findNode(&this_00->data,iVar2 + -1,0);
    this->cb = uVar3;
    this->cf = (QTextFrame *)0x0;
  }
LAB_004ab01d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QTextFrame::iterator &QTextFrame::iterator::operator--()
{
    const QTextDocumentPrivate *priv = QTextDocumentPrivate::get(f);
    const QTextDocumentPrivate::BlockMap &map = priv->blockMap();
    if (cf) {
        int start = cf->firstPosition() - 1;
        cb = map.findNode(start);
        cf = nullptr;
    } else {
        if (cb == b)
            goto end;
        if (cb != e) {
            int pos = map.position(cb);
            // check if we have to enter a frame
            QTextDocumentPrivate::FragmentIterator frag = priv->find(pos-1);
            if (priv->buffer().at(frag->stringPosition) != QChar::ParagraphSeparator) {
                QTextFrame *pf = qobject_cast<QTextFrame *>(priv->objectForFormat(frag->format));
                if (pf) {
                    if (priv->buffer().at(frag->stringPosition) == QTextBeginningOfFrame) {
                        Q_ASSERT(pf == f);
                    } else if (priv->buffer().at(frag->stringPosition) == QTextEndOfFrame) {
                        Q_ASSERT(pf != f);
                        cf = pf;
                        cb = 0;
                        goto end;
                    }
                }
            }
        }
        cb = map.previous(cb);
    }
 end:
    return *this;
}